

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_writer.hpp
# Opt level: O1

void __thiscall
duckdb::ColumnWriter::Analyze
          (ColumnWriter *this,ColumnWriterState *state,ColumnWriterState *parent,Vector *vector,
          idx_t count)

{
  NotImplementedException *this_00;
  string local_40;
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Writer does not need analysis","");
  NotImplementedException::NotImplementedException(this_00,&local_40);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

virtual void Analyze(ColumnWriterState &state, ColumnWriterState *parent, Vector &vector, idx_t count) {
		throw NotImplementedException("Writer does not need analysis");
	}